

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O2

SstMetaMetaList SstGetNewMetaMetaData(SstStream Stream,size_t UTimestep)

{
  SstMetaMetaList p_Var1;
  size_t *psVar2;
  long lVar3;
  ulong uVar4;
  
  pthread_mutex_lock((pthread_mutex_t *)&Stream->DataLock);
  uVar4 = (ulong)(uint)Stream->InternalMetaMetaCount;
  if (Stream->InternalMetaMetaCount < 1) {
    p_Var1 = (SstMetaMetaList)0x0;
  }
  else {
    p_Var1 = (SstMetaMetaList)malloc(uVar4 * 0x20 + 0x20);
    psVar2 = &Stream->InternalMetaMetaInfo->IDSize;
    for (lVar3 = 0; uVar4 * 0x20 != lVar3; lVar3 = lVar3 + 0x20) {
      *(char **)((long)&p_Var1->BlockData + lVar3) = (char *)psVar2[-3];
      *(size_t *)((long)&p_Var1->BlockSize + lVar3) = psVar2[-2];
      *(char **)((long)&p_Var1->ID + lVar3) = (char *)psVar2[-1];
      *(size_t *)((long)&p_Var1->IDSize + lVar3) = *psVar2;
      psVar2 = psVar2 + 5;
    }
    p_Var1[uVar4].ID = (char *)0x0;
    (&p_Var1[uVar4].ID)[1] = (char *)0x0;
    p_Var1[uVar4].BlockData = (char *)0x0;
    p_Var1[uVar4].BlockSize = 0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&Stream->DataLock);
  return p_Var1;
}

Assistant:

extern SstMetaMetaList SstGetNewMetaMetaData(SstStream Stream, size_t UTimestep)
{
    ssize_t Timestep = (ssize_t)UTimestep;
    int RetCount = 0;
    STREAM_MUTEX_LOCK(Stream);
    ssize_t LastRetTimestep = -1;
    int i;
    for (i = 0; i < Stream->InternalMetaMetaCount; i++)
    {
        if ((LastRetTimestep == -1) ||
            (Stream->InternalMetaMetaInfo[i].TimestepAdded >= LastRetTimestep))
            RetCount++;
    }
    if (RetCount == 0)
    {
        STREAM_MUTEX_UNLOCK(Stream);
        return NULL;
    }
    SstMetaMetaList ret = malloc(sizeof(ret[0]) * (RetCount + 1));
    int j = 0;
    for (i = 0; i < Stream->InternalMetaMetaCount; i++)
    {
        if ((LastRetTimestep == -1) ||
            (Stream->InternalMetaMetaInfo[i].TimestepAdded >= LastRetTimestep))
        {
            // no copies, keep memory ownership in SST
            ret[j].BlockData = Stream->InternalMetaMetaInfo[i].BlockData;
            ret[j].BlockSize = Stream->InternalMetaMetaInfo[i].BlockSize;
            ret[j].ID = Stream->InternalMetaMetaInfo[i].ID;
            ret[j].IDSize = Stream->InternalMetaMetaInfo[i].IDSize;
            j++;
        }
    }
    memset(&ret[j], 0, sizeof(ret[j]));
    LastRetTimestep = Timestep;
    STREAM_MUTEX_UNLOCK(Stream);
    return ret;
}